

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  REF_INT tri;
  char *pcVar7;
  REF_STATUS RVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  REF_DBL quality;
  REF_DBL tri_ideal [3];
  REF_INT nodes [27];
  double local_d8;
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  *ideal_location = 0.0;
  ideal_location[1] = 0.0;
  ideal_location[2] = 0.0;
  local_d8 = 0.0;
  if (((node < 0) || (pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= node)) ||
     (lVar10 = (long)pRVar1->first[(uint)node], lVar10 == -1)) {
LAB_001cadcf:
    dVar11 = local_d8 * 1e+20;
    if (dVar11 <= -dVar11) {
      dVar11 = -dVar11;
    }
    if (dVar11 <= 1.0) {
      pRVar3 = ref_grid->node->real;
      lVar10 = (long)(node * 0xf);
      printf("normalization = %e at %e %e %e\n",local_d8,pRVar3[lVar10],pRVar3[lVar10 + 1],
             pRVar3[lVar10 + 2]);
      RVar8 = 4;
    }
    else {
      RVar8 = 0;
      lVar10 = 0;
      do {
        ideal_location[lVar10] = ideal_location[lVar10] * (1.0 / local_d8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
    }
  }
  else {
    tri = pRVar1->item[lVar10].ref;
    uVar4 = ref_smooth_tri_ideal(ref_grid,node,tri,local_c8);
    if (uVar4 == 0) {
      local_d8 = 0.0;
      do {
        uVar4 = ref_cell_nodes(ref_grid->cell[3],tri,local_a8);
        if (uVar4 != 0) {
          uVar9 = (ulong)uVar4;
          pcVar7 = "nodes";
          uVar6 = 0x223;
          goto LAB_001cacf5;
        }
        uVar4 = ref_node_tri_quality(ref_grid->node,local_a8,&local_d0);
        if (uVar4 != 0) {
          uVar9 = (ulong)uVar4;
          pcVar7 = "tri qual";
          uVar6 = 0x225;
          goto LAB_001cacf5;
        }
        dVar11 = ref_grid->adapt->smooth_min_quality;
        if (local_d0 <= dVar11) {
          local_d0 = dVar11;
        }
        lVar5 = 0;
        do {
          ideal_location[lVar5] = local_c8[lVar5] * (1.0 / local_d0) + ideal_location[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_d8 = local_d8 + 1.0 / local_d0;
        pRVar2 = ref_grid->cell[3]->ref_adj->item;
        lVar10 = (long)pRVar2[(int)lVar10].next;
        if (lVar10 == -1) goto LAB_001cadcf;
        tri = pRVar2[lVar10].ref;
        uVar4 = ref_smooth_tri_ideal(ref_grid,node,tri,local_c8);
      } while (uVar4 == 0);
    }
    uVar9 = (ulong)uVar4;
    pcVar7 = "tri ideal";
    uVar6 = 0x222;
LAB_001cacf5:
    RVar8 = (REF_STATUS)uVar9;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar6,
           "ref_smooth_tri_weighted_ideal",uVar9,pcVar7);
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tri_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tri(ref_grid), node, item, cell) {
    RSS(ref_smooth_tri_ideal(ref_grid, node, cell, tri_ideal), "tri ideal");
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tri qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tri_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e at %e %e %e\n", normalization,
           ref_node_xyz(ref_grid_node(ref_grid), 0, node),
           ref_node_xyz(ref_grid_node(ref_grid), 1, node),
           ref_node_xyz(ref_grid_node(ref_grid), 2, node));
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}